

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_rff.cpp
# Opt level: O2

bool __thiscall FRFFFile::Open(FRFFFile *this,bool quiet)

{
  BYTE *pBVar1;
  FileReader *pFVar2;
  undefined4 uVar3;
  void *data;
  ulong *puVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  FRFFLump *pFVar8;
  char *__src;
  bool bVar9;
  char name [13];
  FString local_48;
  undefined1 local_40 [8];
  uint local_38;
  uint local_34;
  
  pFVar2 = (this->super_FResourceFile).Reader;
  (*(pFVar2->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar2,local_40,0x10);
  (this->super_FResourceFile).NumLumps = local_34;
  data = operator_new__((ulong)local_34 * 0x30);
  pFVar2 = (this->super_FResourceFile).Reader;
  (*(pFVar2->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar2,(ulong)local_38,0);
  pFVar2 = (this->super_FResourceFile).Reader;
  (*(pFVar2->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar2,data,(ulong)local_34 * 0x30);
  BloodCrypt(data,local_38,local_34 * 0x30);
  uVar6 = (ulong)(this->super_FResourceFile).NumLumps;
  puVar4 = (ulong *)operator_new__(uVar6 * 0x58 + 8);
  *puVar4 = uVar6;
  if (uVar6 != 0) {
    lVar7 = 0;
    pFVar8 = (FRFFLump *)(puVar4 + 1);
    do {
      FRFFLump::FRFFLump(pFVar8);
      lVar7 = lVar7 + -0x58;
      pFVar8 = pFVar8 + 1;
    } while (uVar6 * -0x58 - lVar7 != 0);
  }
  this->Lumps = (FRFFLump *)(puVar4 + 1);
  if ((!quiet) && (batchrun == false)) {
    Printf(", %d lumps\n");
  }
  __src = (char *)((long)data + 0x24);
  lVar7 = 0;
  uVar6 = 0;
  do {
    if ((this->super_FResourceFile).NumLumps <= uVar6) {
      operator_delete__(data);
      return true;
    }
    pFVar8 = this->Lumps;
    *(undefined4 *)(&(pFVar8->super_FUncompressedLump).super_FResourceLump.field_0x4c + lVar7) =
         *(undefined4 *)(__src + -0x14);
    *(undefined4 *)((long)&(pFVar8->super_FUncompressedLump).super_FResourceLump.LumpSize + lVar7) =
         *(undefined4 *)(__src + -0x10);
    *(FRFFFile **)((long)&(pFVar8->super_FUncompressedLump).super_FResourceLump.Owner + lVar7) =
         this;
    if ((__src[-4] & 0x10U) != 0) {
      pBVar1 = &(pFVar8->super_FUncompressedLump).super_FResourceLump.Flags + lVar7;
      *pBVar1 = *pBVar1 | 8;
    }
    *(undefined4 *)((long)&pFVar8->IndexNum + lVar7) = *(undefined4 *)(__src + 8);
    strncpy(name,__src,8);
    name[8] = '\0';
    sVar5 = strlen(name);
    if (0xc < sVar5 + 4) {
      __assert_fail("len + 4 <= 12",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/resourcefiles/file_rff.cpp"
                    ,0xab,"virtual bool FRFFFile::Open(bool)");
    }
    name[sVar5] = '.';
    name[sVar5 + 1] = __src[-3];
    name[sVar5 + 2] = __src[-2];
    name[sVar5 + 3] = __src[-1];
    name[sVar5 + 4] = '\0';
    FString::FString(&local_48,name);
    FResourceLump::LumpNameSetup
              ((FResourceLump *)
               ((long)&(pFVar8->super_FUncompressedLump).super_FResourceLump._vptr_FResourceLump +
               lVar7),&local_48);
    FString::~FString(&local_48);
    if (name[sVar5 + 1] == 'R') {
      if (name[sVar5 + 2] == 'A') {
        bVar9 = name[sVar5 + 3] == 'W';
        uVar3 = 6;
        goto LAB_0057fb27;
      }
    }
    else if ((name[sVar5 + 1] == 'S') && (name[sVar5 + 2] == 'F')) {
      bVar9 = name[sVar5 + 3] == 'X';
      uVar3 = 7;
LAB_0057fb27:
      if (bVar9) {
        *(undefined4 *)
         ((long)&(this->Lumps->super_FUncompressedLump).super_FResourceLump.Namespace + lVar7) =
             uVar3;
      }
    }
    uVar6 = uVar6 + 1;
    lVar7 = lVar7 + 0x58;
    __src = __src + 0x30;
  } while( true );
}

Assistant:

bool FRFFFile::Open(bool quiet)
{
	RFFLump *lumps;
	RFFInfo header;

	Reader->Read(&header, sizeof(header));

	NumLumps = LittleLong(header.NumLumps);
	header.DirOfs = LittleLong(header.DirOfs);
	lumps = new RFFLump[header.NumLumps];
	Reader->Seek (header.DirOfs, SEEK_SET);
	Reader->Read (lumps, header.NumLumps * sizeof(RFFLump));
	BloodCrypt (lumps, header.DirOfs, header.NumLumps * sizeof(RFFLump));

	Lumps = new FRFFLump[NumLumps];

	if (!quiet && !batchrun) Printf(", %d lumps\n", NumLumps);
	for (DWORD i = 0; i < NumLumps; ++i)
	{
		Lumps[i].Position = LittleLong(lumps[i].FilePos);
		Lumps[i].LumpSize = LittleLong(lumps[i].Size);
		Lumps[i].Owner = this;
		if (lumps[i].Flags & 0x10)
		{
			Lumps[i].Flags |= LUMPF_BLOODCRYPT;
		}
		Lumps[i].IndexNum = LittleLong(lumps[i].IndexNum);
		// Rearrange the name and extension to construct the fullname.
		char name[13];
		strncpy(name, lumps[i].Name, 8);
		name[8] = 0;
		size_t len = strlen(name);
		assert(len + 4 <= 12);
		name[len+0] = '.';
		name[len+1] = lumps[i].Extension[0];
		name[len+2] = lumps[i].Extension[1];
		name[len+3] = lumps[i].Extension[2];
		name[len+4] = 0;
		Lumps[i].LumpNameSetup(name);
		if (name[len+1] == 'S' && name[len+2] == 'F' && name[len+3] == 'X')
		{
			Lumps[i].Namespace = ns_bloodsfx;
		}
		else if (name[len+1] == 'R' && name[len+2] == 'A' && name[len+3] == 'W')
		{
			Lumps[i].Namespace = ns_bloodraw;
		}
	}
	delete[] lumps;
	return true;
}